

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_bytearray.c
# Opt level: O0

adt_error_t adt_bytearray_realloc(adt_bytearray_t *self,uint32_t u32NewLen)

{
  uint8_t *__dest;
  uint local_30;
  uint32_t u32CopyLen;
  uint8_t *pNewData;
  uint32_t u32NewLen_local;
  adt_bytearray_t *self_local;
  
  if (self == (adt_bytearray_t *)0x0) {
    self_local._7_1_ = '\x01';
  }
  else {
    __dest = (uint8_t *)malloc((ulong)u32NewLen);
    if (__dest == (uint8_t *)0x0) {
      self_local._7_1_ = '\x02';
    }
    else {
      if (self->pData != (uint8_t *)0x0) {
        local_30 = u32NewLen;
        if (self->u32CurLen <= u32NewLen) {
          local_30 = self->u32CurLen;
        }
        memcpy(__dest,self->pData,(ulong)local_30);
        free(self->pData);
      }
      self->pData = __dest;
      self->u32AllocLen = u32NewLen;
      self_local._7_1_ = '\0';
    }
  }
  return self_local._7_1_;
}

Assistant:

static adt_error_t adt_bytearray_realloc(adt_bytearray_t *self, uint32_t u32NewLen) {
   if (self != 0) {
      uint8_t *pNewData = (uint8_t*) malloc(u32NewLen);
      if(pNewData != 0){
         if(self->pData != 0) {
            uint32_t u32CopyLen = (u32NewLen < self->u32CurLen)? u32NewLen : self->u32CurLen;
            memcpy(pNewData, self->pData, u32CopyLen);
            free(self->pData);
         }
         self->pData = pNewData;
         self->u32AllocLen = u32NewLen;
      }
      else {
         return ADT_MEM_ERROR;
      }
      return ADT_NO_ERROR;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}